

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O1

LY_ERR lys_compile_feature_iffeatures(lysp_module *pmod)

{
  lysp_feature ***ppplVar1;
  ly_ctx *ctx;
  lyd_node *plVar2;
  lyd_node *plVar3;
  long lVar4;
  bool bVar5;
  LY_ERR LVar6;
  lysp_feature *last;
  long *plVar7;
  ulong uVar8;
  lysp_feature **pplVar9;
  undefined8 *puVar10;
  lysp_feature *plVar11;
  void *pvVar12;
  size_t __n;
  lysc_iffeature *plVar13;
  ulong uVar14;
  void *pvVar15;
  lysp_qname *plVar16;
  long lVar17;
  lysp_feature *plVar18;
  long lVar19;
  LY_ERR unaff_R15D;
  uint32_t idx;
  uint32_t local_74;
  lysp_feature **local_70;
  ly_set local_68;
  lysp_module *local_58;
  ulong local_50;
  ly_ctx *local_48;
  long local_40;
  lysp_feature *local_38;
  
  local_74 = 0;
  last = (lysp_feature *)0x0;
  do {
    do {
      last = lysp_feature_next(last,pmod,&local_74);
      if (last == (lysp_feature *)0x0) {
        return LY_SUCCESS;
      }
      plVar16 = last->iffeatures;
    } while (plVar16 == (lysp_qname *)0x0);
    plVar13 = last->iffeatures_c;
    if (plVar13 == (lysc_iffeature *)0x0) {
      plVar7 = (long *)calloc(1,*(long *)&plVar16[-1].flags << 4 | 8);
    }
    else {
      plVar7 = (long *)realloc(&plVar13[-1].features,
                               (*(long *)&plVar16[-1].flags + (long)plVar13[-1].features) * 0x10 | 8
                              );
    }
    if (plVar7 == (long *)0x0) {
      bVar5 = false;
      unaff_R15D = LY_EMEM;
      ly_log(pmod->mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_feature_iffeatures");
    }
    else {
      last->iffeatures_c = (lysc_iffeature *)(plVar7 + 1);
      if (last->iffeatures == (lysp_qname *)0x0) {
        __n = 0;
      }
      else {
        __n = *(long *)&last->iffeatures[-1].flags << 4;
      }
      memset(plVar7 + *plVar7 * 2 + 1,0,__n);
      bVar5 = true;
    }
    if (!bVar5) {
      return unaff_R15D;
    }
    uVar14 = 0xffffffffffffffff;
    lVar19 = 0;
    lVar17 = 0;
    while( true ) {
      plVar16 = last->iffeatures;
      if (plVar16 == (lysp_qname *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = *(ulong *)&plVar16[-1].flags;
      }
      uVar14 = uVar14 + 1;
      if (uVar8 <= uVar14) break;
      plVar13 = last->iffeatures_c;
      ppplVar1 = &plVar13[-1].features;
      *ppplVar1 = (lysp_feature **)((long)*ppplVar1 + 1);
      plVar16 = (lysp_qname *)((long)&plVar16->str + lVar17);
      lVar17 = lVar17 + 0x18;
      plVar13 = (lysc_iffeature *)((long)&plVar13->expr + lVar19);
      lVar19 = lVar19 + 0x10;
      LVar6 = lys_compile_iffeature(pmod->mod->ctx,plVar16,plVar13);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
    }
    local_70 = (lysp_feature **)0x0;
    local_58 = pmod;
    while( true ) {
      if (last->iffeatures_c == (lysc_iffeature *)0x0) {
        pplVar9 = (lysp_feature **)0x0;
      }
      else {
        pplVar9 = last->iffeatures_c[-1].features;
      }
      if (pplVar9 <= local_70) break;
      plVar18 = (lysp_feature *)0x0;
LAB_00156a15:
      lVar17 = (long)local_70 * 0x10;
      pplVar9 = last->iffeatures_c[(long)local_70].features;
      if (pplVar9 == (lysp_feature **)0x0) {
        plVar11 = (lysp_feature *)0x0;
      }
      else {
        plVar11 = pplVar9[-1];
      }
      if (plVar18 < plVar11) {
        plVar11 = pplVar9[(long)plVar18];
        ctx = pmod->mod->ctx;
        if (last == plVar11) {
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Feature \"%s\" is referenced from itself.",
                  last->name);
          return LY_EVALID;
        }
        pplVar9 = last->depfeatures;
        local_68.size = 0;
        local_68.count = 0;
        local_68.field_2.dnodes = (lyd_node **)0x0;
        local_38 = plVar18;
        if (pplVar9 != (lysp_feature **)0x0) {
          local_48 = ctx;
          local_40 = lVar17;
          if (pplVar9[-1] != (lysp_feature *)0x0) {
            plVar18 = (lysp_feature *)0x0;
            do {
              if (pplVar9[(long)plVar18] == plVar11) goto LAB_00156b1d;
              LVar6 = ly_set_add(&local_68,pplVar9[(long)plVar18],'\0',(uint32_t *)0x0);
              if (LVar6 != LY_SUCCESS) goto LAB_00156b46;
              plVar18 = (lysp_feature *)((long)&plVar18->name + 1);
            } while (plVar18 < pplVar9[-1]);
          }
          LVar6 = LY_SUCCESS;
          if (local_68.count != 0) {
            uVar14 = 0;
            do {
              plVar2 = local_68.field_2.dnodes[uVar14];
              pvVar15 = (void *)0x0;
              local_50 = uVar14;
              while( true ) {
                plVar3 = plVar2->next;
                if (plVar3 == (lyd_node *)0x0) {
                  pvVar12 = (void *)0x0;
                }
                else {
                  pvVar12 = plVar3[-1].priv;
                }
                if (pvVar12 <= pvVar15) break;
                if (*(lysp_feature **)(&plVar3->hash + (long)pvVar15 * 2) == plVar11)
                goto LAB_00156b1d;
                ly_set_add(&local_68,*(lysp_feature **)(&plVar3->hash + (long)pvVar15 * 2),'\0',
                           (uint32_t *)0x0);
                pvVar15 = (void *)((long)pvVar15 + 1);
              }
              uVar14 = local_50 + 1;
              LVar6 = LY_SUCCESS;
            } while (uVar14 < (ulong)local_68._0_8_ >> 0x20);
          }
          goto LAB_00156b46;
        }
        LVar6 = LY_SUCCESS;
        goto LAB_00156b5c;
      }
      local_70 = (lysp_feature **)((long)local_70 + 1);
    }
  } while( true );
LAB_00156b1d:
  ly_vlog(local_48,(char *)0x0,LYVE_REFERENCE,"Feature \"%s\" is indirectly referenced from itself."
          ,plVar11->name);
  LVar6 = LY_EVALID;
LAB_00156b46:
  ly_set_erase(&local_68,(_func_void_void_ptr *)0x0);
  lVar17 = local_40;
LAB_00156b5c:
  plVar18 = local_38;
  pmod = local_58;
  if (LVar6 != LY_SUCCESS) {
    return LVar6;
  }
  lVar19 = *(long *)(*(long *)(*(long *)((long)&last->iffeatures_c->features + lVar17) +
                              (long)local_38 * 8) + 0x18);
  if (lVar19 == 0) {
    puVar10 = (undefined8 *)malloc(0x10);
    if (puVar10 != (undefined8 *)0x0) {
      *puVar10 = 1;
      goto LAB_00156bd6;
    }
  }
  else {
    lVar4 = *(long *)(lVar19 + -8);
    *(long *)(lVar19 + -8) = lVar4 + 1;
    puVar10 = (undefined8 *)realloc((void *)(lVar19 + -8),lVar4 * 8 + 0x10);
    if (puVar10 != (undefined8 *)0x0) {
LAB_00156bd6:
      *(undefined8 **)
       (*(long *)(*(long *)((long)&last->iffeatures_c->features + lVar17) + (long)plVar18 * 8) +
       0x18) = puVar10 + 1;
      bVar5 = true;
      goto LAB_00156c1a;
    }
    plVar7 = (long *)(*(long *)(*(long *)(*(long *)((long)&last->iffeatures_c->features + lVar17) +
                                         (long)plVar18 * 8) + 0x18) + -8);
    *plVar7 = *plVar7 + -1;
  }
  bVar5 = false;
  unaff_R15D = LY_EMEM;
  ly_log(pmod->mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
         "lys_compile_feature_iffeatures");
LAB_00156c1a:
  if (!bVar5) {
    return unaff_R15D;
  }
  lVar17 = *(long *)(*(long *)(*(long *)((long)&last->iffeatures_c->features + lVar17) +
                              (long)plVar18 * 8) + 0x18);
  *(lysp_feature **)(lVar17 + -8 + *(long *)(lVar17 + -8) * 8) = last;
  plVar18 = (lysp_feature *)((long)&plVar18->name + 1);
  goto LAB_00156a15;
}

Assistant:

LY_ERR
lys_compile_feature_iffeatures(struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysp_feature *f = NULL, **df;
    uint32_t idx = 0;

    while ((f = lysp_feature_next(f, pmod, &idx))) {
        if (!f->iffeatures) {
            continue;
        }

        /* compile if-features */
        LY_ARRAY_CREATE_RET(pmod->mod->ctx, f->iffeatures_c, LY_ARRAY_COUNT(f->iffeatures), LY_EMEM);
        LY_ARRAY_FOR(f->iffeatures, u) {
            LY_ARRAY_INCREMENT(f->iffeatures_c);
            LY_CHECK_RET(lys_compile_iffeature(pmod->mod->ctx, &(f->iffeatures)[u], &(f->iffeatures_c)[u]));
        }
        LY_ARRAY_FOR(f->iffeatures_c, u) {
            LY_ARRAY_FOR(f->iffeatures_c[u].features, v) {
                /* check for circular dependency - direct reference first,... */
                if (f == f->iffeatures_c[u].features[v]) {
                    LOGVAL(pmod->mod->ctx, LYVE_REFERENCE, "Feature \"%s\" is referenced from itself.", f->name);
                    return LY_EVALID;
                }
                /* ... and indirect circular reference */
                LY_CHECK_RET(lys_compile_feature_circular_check(pmod->mod->ctx, f->iffeatures_c[u].features[v], f->depfeatures));

                /* add itself into the dependants list */
                LY_ARRAY_NEW_RET(pmod->mod->ctx, f->iffeatures_c[u].features[v]->depfeatures, df, LY_EMEM);
                *df = f;
            }
        }
    }

    return LY_SUCCESS;
}